

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O0

void av1_update_and_record_txb_context
               (int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,TX_SIZE tx_size,
               void *arg)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int in_ECX;
  undefined4 in_EDX;
  int in_ESI;
  int in_EDI;
  undefined4 in_R8D;
  byte in_R9B;
  long *in_stack_00000008;
  uint8_t cul_level;
  int dc_sign_ctx;
  int dc_sign;
  int lps;
  int k;
  int idx;
  int br_ctx;
  int base_range;
  tran_low_t level;
  tran_low_t v;
  int coeff_ctx;
  int pos;
  int c;
  int8_t coeff_contexts [4096];
  int16_t *scan;
  TX_CLASS tx_class;
  uint8_t *levels;
  uint8_t levels_buf [1312];
  tran_low_t *tcoeff_txb;
  int seg_eob;
  int segment_id;
  uint8_t *entropy_ctx;
  uint16_t *eob_txb;
  int txb_offset;
  CB_COEFF_BUFFER *cb_coef_buff;
  FRAME_CONTEXT *ec_ctx;
  TX_SIZE txsize_ctx;
  uint8_t allow_update_cdf;
  int height;
  int width;
  int bhl;
  TXB_CTX txb_ctx;
  MB_MODE_INFO *mbmi;
  tran_low_t *tcoeff;
  SCAN_ORDER *scan_order;
  TX_TYPE tx_type;
  PLANE_TYPE plane_type;
  tran_low_t *qcoeff;
  int block_offset;
  int eob;
  macroblockd_plane *pd;
  macroblock_plane *p;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  ThreadData *td;
  AV1_COMMON *cm;
  AV1_COMP *cpi;
  tokenize_b_args *args;
  int mag;
  int pos_1;
  int stride;
  int row;
  int col;
  undefined4 in_stack_ffffffffffffe918;
  TX_SIZE tx_size_00;
  int in_stack_ffffffffffffe91c;
  segmentation *in_stack_ffffffffffffe920;
  undefined4 in_stack_ffffffffffffe928;
  int in_stack_ffffffffffffe92c;
  int in_stack_ffffffffffffe930;
  ushort in_stack_ffffffffffffe934;
  TX_SIZE in_stack_ffffffffffffe936;
  BLOCK_SIZE in_stack_ffffffffffffe937;
  tran_low_t *in_stack_ffffffffffffe938;
  int in_stack_ffffffffffffe940;
  int in_stack_ffffffffffffe944;
  int in_stack_ffffffffffffe948;
  int in_stack_ffffffffffffe94c;
  undefined1 in_stack_ffffffffffffe950;
  PLANE_TYPE in_stack_ffffffffffffe951;
  TX_SIZE in_stack_ffffffffffffe952;
  BLOCK_SIZE in_stack_ffffffffffffe953;
  int in_stack_ffffffffffffe954;
  AV1_COMMON *in_stack_ffffffffffffe958;
  undefined4 in_stack_ffffffffffffe960;
  int in_stack_ffffffffffffe964;
  int8_t *in_stack_ffffffffffffe968;
  int in_stack_ffffffffffffe970;
  undefined4 in_stack_ffffffffffffe984;
  int local_1670;
  int local_1668;
  uint local_164c;
  char local_1648 [4104];
  int16_t *local_640;
  TX_CLASS local_631;
  uint8_t *local_630;
  uint8_t local_628 [1312];
  long local_108;
  int local_100;
  uint local_fc;
  long local_f8;
  long local_f0;
  uint local_e4;
  long local_e0;
  long local_d8;
  byte local_ce;
  char local_cd;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  long local_b8;
  tran_low_t *local_b0;
  SCAN_ORDER *local_a8;
  byte local_9a;
  byte local_99;
  int *local_98;
  int local_90;
  uint local_8c;
  byte *local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long *local_50;
  byte local_42;
  undefined1 local_41;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  TX_CLASS local_19;
  int local_18;
  int local_14;
  uint8_t *local_10;
  int local_4;
  
  local_41 = (undefined1)in_R8D;
  local_50 = in_stack_00000008;
  local_58 = *in_stack_00000008;
  local_60 = local_58 + 0x3bf80;
  local_70 = in_stack_00000008[1];
  local_78 = local_70 + 0x1a0;
  local_80 = local_70 + (long)in_EDI * 0x88;
  local_88 = (byte *)(local_70 + 0x1b0 + (long)in_EDI * 0xa30);
  local_8c = (uint)*(ushort *)(*(long *)(local_80 + 0x20) + (long)in_ESI * 2);
  local_90 = in_ESI << 4;
  local_98 = (int *)(*(long *)(local_80 + 0x10) + (long)local_90 * 4);
  local_99 = *local_88;
  local_68 = local_70;
  local_42 = in_R9B;
  local_38 = in_ESI;
  local_34 = in_EDI;
  local_9a = av1_get_tx_type((MACROBLOCKD *)
                             CONCAT44(in_stack_ffffffffffffe94c,in_stack_ffffffffffffe948),
                             (PLANE_TYPE)((uint)in_stack_ffffffffffffe944 >> 0x18),
                             in_stack_ffffffffffffe940,
                             (int)((ulong)in_stack_ffffffffffffe938 >> 0x20),
                             (TX_SIZE)((ulong)in_stack_ffffffffffffe938 >> 0x18),
                             CONCAT13(in_stack_ffffffffffffe937,
                                      CONCAT12(in_stack_ffffffffffffe936,in_stack_ffffffffffffe934))
                            );
  local_a8 = get_scan('\0','\0');
  if (*(char *)((long)local_50 + 0x15) == '\0') {
    local_b8 = **(long **)(local_78 + 0x1eb8);
    get_txb_ctx(in_stack_ffffffffffffe937,in_stack_ffffffffffffe936,in_stack_ffffffffffffe930,
                (ENTROPY_CONTEXT *)CONCAT44(in_stack_ffffffffffffe92c,in_stack_ffffffffffffe928),
                (ENTROPY_CONTEXT *)in_stack_ffffffffffffe920,
                (TXB_CTX *)CONCAT44(in_stack_ffffffffffffe91c,in_stack_ffffffffffffe918));
    tx_size_00 = (TX_SIZE)((uint)in_stack_ffffffffffffe918 >> 0x18);
    local_c4 = get_txb_bhl('\0');
    local_c8 = get_txb_wide('\0');
    local_cc = get_txb_high('\0');
    local_cd = *(char *)((long)local_50 + 0x14);
    local_ce = get_txsize_entropy_ctx(local_42);
    local_d8 = *(long *)(local_78 + 0x2998);
    if (local_cd != '\0') {
      update_cdf((aom_cdf_prob *)(local_d8 + (ulong)local_ce * 0x4e + (long)local_c0 * 6),
                 local_8c == 0,2);
    }
    local_e0 = *(long *)(local_70 + 0x4190);
    local_e4 = *(ushort *)(*(long *)(local_70 + 0x4178) + 0x4e + (ulong)local_99 * 2) / 0x10;
    local_f0 = *(long *)(local_e0 + 0x18 + (long)local_34 * 8) + (long)(int)local_e4 * 2;
    local_f8 = *(long *)(local_e0 + 0x30 + (long)local_34 * 8) + (long)(int)local_e4;
    *(char *)(local_f8 + local_38) = (char)local_c0;
    *(short *)(local_f0 + (long)local_38 * 2) = (short)local_8c;
    if (local_8c == 0) {
      av1_set_entropy_contexts
                ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffe964,in_stack_ffffffffffffe960),
                 (macroblockd_plane *)in_stack_ffffffffffffe958,in_stack_ffffffffffffe954,
                 in_stack_ffffffffffffe953,in_stack_ffffffffffffe952,in_stack_ffffffffffffe94c,
                 in_stack_ffffffffffffe970,in_ECX);
      return;
    }
    local_fc = (uint)((byte)*(undefined2 *)(local_b8 + 0xa7) & 7);
    local_100 = av1_get_tx_eob(in_stack_ffffffffffffe920,in_stack_ffffffffffffe91c,tx_size_00);
    local_108 = *(long *)(local_e0 + (long)local_34 * 8) +
                (long)(int)(uint)*(ushort *)
                                  (*(long *)(local_70 + 0x4178) + 0x4e + (ulong)local_99 * 2) * 4;
    local_b0 = (tran_low_t *)(local_108 + (long)local_90 * 4);
    memcpy(local_b0,local_98,(long)local_100 << 2);
    local_630 = set_levels(local_628,local_cc);
    (*av1_txb_init_levels)(local_b0,local_c8,local_cc,local_630);
    update_tx_type_count
              ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffe964,in_stack_ffffffffffffe960),
               in_stack_ffffffffffffe958,
               (MACROBLOCKD *)
               CONCAT44(in_stack_ffffffffffffe954,
                        CONCAT13(in_stack_ffffffffffffe953,
                                 CONCAT12(in_stack_ffffffffffffe952,
                                          CONCAT11(in_stack_ffffffffffffe951,
                                                   in_stack_ffffffffffffe950)))),
               in_stack_ffffffffffffe94c,in_stack_ffffffffffffe948,in_stack_ffffffffffffe944,
               (TX_SIZE)in_stack_ffffffffffffe970,(FRAME_COUNTS *)CONCAT44(in_EDX,in_ECX),
               (uint8_t)in_ESI);
    local_631 = ""[local_9a];
    local_640 = local_a8->scan;
    lVar6 = local_68 + 0x256c8 + (ulong)local_42 * 0x40;
    *(int *)(lVar6 + (ulong)local_9a * 4) = *(int *)(lVar6 + (ulong)local_9a * 4) + 1;
    update_eob_context(in_stack_ffffffffffffe954,in_stack_ffffffffffffe953,in_stack_ffffffffffffe952
                       ,in_stack_ffffffffffffe951,
                       (FRAME_CONTEXT *)
                       CONCAT44(in_stack_ffffffffffffe94c,in_stack_ffffffffffffe948),
                       (uint8_t)((uint)in_stack_ffffffffffffe944 >> 0x18));
    av1_get_nz_map_contexts_sse2
              ((uint8_t *)CONCAT44(in_stack_ffffffffffffe984,in_ESI),
               (int16_t *)CONCAT44(in_EDX,in_ECX),(uint16_t)((uint)in_R8D >> 0x10),
               (TX_SIZE)((uint)in_R8D >> 8),(TX_CLASS)in_R8D,in_stack_ffffffffffffe968);
    local_164c = local_8c;
LAB_00252ae1:
    local_164c = local_164c - 1;
    if (-1 < (int)local_164c) {
      iVar4 = (int)local_640[(int)local_164c];
      cVar1 = local_1648[iVar4];
      iVar5 = local_98[iVar4];
      if (iVar5 < 1) {
        iVar5 = -iVar5;
      }
      if ((*(byte *)(local_58 + 0x9ae91) & 1) != 0) {
        *(long *)(local_68 + 0x25d30) = (long)iVar5 + *(long *)(local_68 + 0x25d30);
      }
      if (local_cd != '\0') {
        if (local_164c == local_8c - 1) {
          in_stack_ffffffffffffe964 = iVar5;
          if (2 < iVar5) {
            in_stack_ffffffffffffe964 = 3;
          }
          update_cdf((aom_cdf_prob *)
                     (local_d8 + 0x5be + (ulong)local_ce * 0x40 + (ulong)local_99 * 0x20 +
                     (long)(int)cVar1 * 8),(char)in_stack_ffffffffffffe964 + -1,3);
        }
        else {
          in_stack_ffffffffffffe958 =
               (AV1_COMMON *)
               (local_d8 + 0x6fe + (ulong)local_ce * 0x348 + (ulong)local_99 * 0x1a4 +
               (long)(int)cVar1 * 10);
          in_stack_ffffffffffffe954 = iVar5;
          if (2 < iVar5) {
            in_stack_ffffffffffffe954 = 3;
          }
          update_cdf((aom_cdf_prob *)in_stack_ffffffffffffe958,(int8_t)in_stack_ffffffffffffe954,4);
        }
      }
      if (2 < iVar5) {
        local_10 = local_630;
        local_18 = local_c4;
        iVar2 = local_18;
        local_19 = local_631;
        local_18._0_1_ = (byte)local_c4;
        local_20 = iVar4 >> ((byte)local_18 & 0x1f);
        local_24 = iVar4 - (local_20 << ((byte)local_18 & 0x1f));
        local_28 = (1 << ((byte)local_18 & 0x1f)) + 4;
        local_2c = local_20 * local_28 + local_24;
        local_30 = (uint)local_630[(long)local_2c + 1] + (uint)local_630[local_2c + local_28];
        in_stack_ffffffffffffe952 = '\0';
        in_stack_ffffffffffffe953 = BLOCK_4X4;
        if (local_631 == '\0') {
          if ((uint)((int)((uint)local_630[local_2c + local_28 + 1] + local_30 + 1) >> 1) < 6) {
            in_stack_ffffffffffffe94c =
                 (int)((uint)local_630[local_2c + local_28 + 1] + local_30 + 1) >> 1;
          }
          else {
            in_stack_ffffffffffffe94c = 6;
          }
          local_30 = in_stack_ffffffffffffe94c;
          local_4 = in_stack_ffffffffffffe94c;
          if (iVar4 != 0) {
            if ((1 < local_24) || (1 < local_20)) goto LAB_00252ff7;
            local_4 = in_stack_ffffffffffffe94c + 7;
          }
        }
        else if (local_631 == '\x01') {
          if ((uint)((int)((uint)local_630[local_2c + local_28 * 2] + local_30 + 1) >> 1) < 6) {
            local_30 = (int)((uint)local_630[local_2c + local_28 * 2] + local_30 + 1) >> 1;
          }
          else {
            local_30 = 6;
          }
          local_4 = local_30;
          if (iVar4 != 0) {
            if (local_20 != 0) goto LAB_00252ff7;
            local_4 = local_30 + 7;
          }
        }
        else if (local_631 == '\x02') {
          if ((uint)((int)((uint)local_630[local_2c + 2] + local_30 + 1) >> 1) < 6) {
            local_30 = (int)((uint)local_630[local_2c + 2] + local_30 + 1) >> 1;
          }
          else {
            local_30 = 6;
          }
          local_4 = local_30;
          if (iVar4 != 0) {
            if (local_24 != 0) goto LAB_00252ff7;
            local_4 = local_30 + 7;
          }
        }
        else {
LAB_00252ff7:
          local_4 = local_30 + 0xe;
        }
        iVar3 = local_4;
        local_18 = iVar2;
        local_14 = iVar4;
        for (local_1668 = 0; local_1668 < 0xc; local_1668 = local_1668 + 3) {
          if ((iVar5 + -3) - local_1668 < 3) {
            iVar4 = (iVar5 + -3) - local_1668;
          }
          else {
            iVar4 = 3;
          }
          if (local_cd != '\0') {
            in_stack_ffffffffffffe938 = (tran_low_t *)(local_d8 + 0x1766);
            if (local_ce < 3) {
              in_stack_ffffffffffffe934 = (ushort)local_ce;
            }
            else {
              in_stack_ffffffffffffe934 = 3;
            }
            in_stack_ffffffffffffe937 = BLOCK_4X4;
            in_stack_ffffffffffffe936 = '\0';
            update_cdf((aom_cdf_prob *)
                       ((long)in_stack_ffffffffffffe938 +
                       (long)iVar3 * 10 +
                       (ulong)local_99 * 0xd2 + (long)(int)(uint)in_stack_ffffffffffffe934 * 0x1a4),
                       (int8_t)iVar4,4);
          }
          for (local_1670 = 0; (local_1670 < 3 && (local_1670 != iVar4));
              local_1670 = local_1670 + 1) {
          }
          if (iVar4 < 3) break;
        }
      }
      goto LAB_00252ae1;
    }
    if (*local_b0 != 0) {
      if (local_cd != '\0') {
        update_cdf((aom_cdf_prob *)(local_d8 + 0x3a2 + (ulong)local_99 * 0x12 + (long)local_bc * 6),
                   *local_b0 < 0,2);
      }
      *(byte *)(local_f8 + local_38) = *(byte *)(local_f8 + local_38) | (byte)(local_bc << 4);
    }
  }
  else {
    local_b0 = local_98;
  }
  av1_get_txb_entropy_context
            (in_stack_ffffffffffffe938,
             (SCAN_ORDER *)
             CONCAT17(in_stack_ffffffffffffe937,
                      CONCAT16(in_stack_ffffffffffffe936,
                               CONCAT24(in_stack_ffffffffffffe934,in_stack_ffffffffffffe930))),
             in_stack_ffffffffffffe92c);
  av1_set_entropy_contexts
            ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffe964,in_stack_ffffffffffffe960),
             (macroblockd_plane *)in_stack_ffffffffffffe958,in_stack_ffffffffffffe954,
             in_stack_ffffffffffffe953,in_stack_ffffffffffffe952,in_stack_ffffffffffffe94c,
             in_stack_ffffffffffffe970,in_ECX);
  return;
}

Assistant:

void av1_update_and_record_txb_context(int plane, int block, int blk_row,
                                       int blk_col, BLOCK_SIZE plane_bsize,
                                       TX_SIZE tx_size, void *arg) {
  struct tokenize_b_args *const args = arg;
  const AV1_COMP *cpi = args->cpi;
  const AV1_COMMON *cm = &cpi->common;
  ThreadData *const td = args->td;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  struct macroblock_plane *p = &x->plane[plane];
  struct macroblockd_plane *pd = &xd->plane[plane];
  const int eob = p->eobs[block];
  const int block_offset = BLOCK_OFFSET(block);
  tran_low_t *qcoeff = p->qcoeff + block_offset;
  const PLANE_TYPE plane_type = pd->plane_type;
  const TX_TYPE tx_type =
      av1_get_tx_type(xd, plane_type, blk_row, blk_col, tx_size,
                      cm->features.reduced_tx_set_used);
  const SCAN_ORDER *const scan_order = get_scan(tx_size, tx_type);
  tran_low_t *tcoeff;
  assert(args->dry_run != DRY_RUN_COSTCOEFFS);
  if (args->dry_run == OUTPUT_ENABLED) {
    MB_MODE_INFO *mbmi = xd->mi[0];
    TXB_CTX txb_ctx;
    get_txb_ctx(plane_bsize, tx_size, plane,
                pd->above_entropy_context + blk_col,
                pd->left_entropy_context + blk_row, &txb_ctx);
    const int bhl = get_txb_bhl(tx_size);
    const int width = get_txb_wide(tx_size);
    const int height = get_txb_high(tx_size);
    const uint8_t allow_update_cdf = args->allow_update_cdf;
    const TX_SIZE txsize_ctx = get_txsize_entropy_ctx(tx_size);
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
#if CONFIG_ENTROPY_STATS
    int cdf_idx = cm->coef_cdf_category;
    ++td->counts->txb_skip[cdf_idx][txsize_ctx][txb_ctx.txb_skip_ctx][eob == 0];
#endif  // CONFIG_ENTROPY_STATS
    if (allow_update_cdf) {
      update_cdf(ec_ctx->txb_skip_cdf[txsize_ctx][txb_ctx.txb_skip_ctx],
                 eob == 0, 2);
    }

    CB_COEFF_BUFFER *cb_coef_buff = x->cb_coef_buff;
    const int txb_offset = x->mbmi_ext_frame->cb_offset[plane_type] /
                           (TX_SIZE_W_MIN * TX_SIZE_H_MIN);
    uint16_t *eob_txb = cb_coef_buff->eobs[plane] + txb_offset;
    uint8_t *const entropy_ctx = cb_coef_buff->entropy_ctx[plane] + txb_offset;
    entropy_ctx[block] = txb_ctx.txb_skip_ctx;
    eob_txb[block] = eob;

    if (eob == 0) {
      av1_set_entropy_contexts(xd, pd, plane, plane_bsize, tx_size, 0, blk_col,
                               blk_row);
      return;
    }
    const int segment_id = mbmi->segment_id;
    const int seg_eob = av1_get_tx_eob(&cpi->common.seg, segment_id, tx_size);
    tran_low_t *tcoeff_txb =
        cb_coef_buff->tcoeff[plane] + x->mbmi_ext_frame->cb_offset[plane_type];
    tcoeff = tcoeff_txb + block_offset;
    memcpy(tcoeff, qcoeff, sizeof(*tcoeff) * seg_eob);

    uint8_t levels_buf[TX_PAD_2D];
    uint8_t *const levels = set_levels(levels_buf, height);
    av1_txb_init_levels(tcoeff, width, height, levels);
    update_tx_type_count(cpi, cm, xd, blk_row, blk_col, plane, tx_size,
                         td->counts, allow_update_cdf);

    const TX_CLASS tx_class = tx_type_to_class[tx_type];
    const int16_t *const scan = scan_order->scan;

    // record tx type usage
    td->rd_counts.tx_type_used[tx_size][tx_type]++;

#if CONFIG_ENTROPY_STATS
    update_eob_context(cdf_idx, eob, tx_size, tx_class, plane_type, ec_ctx,
                       td->counts, allow_update_cdf);
#else
    update_eob_context(eob, tx_size, tx_class, plane_type, ec_ctx,
                       allow_update_cdf);
#endif

    DECLARE_ALIGNED(16, int8_t, coeff_contexts[MAX_TX_SQUARE]);
    av1_get_nz_map_contexts(levels, scan, eob, tx_size, tx_class,
                            coeff_contexts);

    for (int c = eob - 1; c >= 0; --c) {
      const int pos = scan[c];
      const int coeff_ctx = coeff_contexts[pos];
      const tran_low_t v = qcoeff[pos];
      const tran_low_t level = abs(v);
      /* abs_sum_level is needed to decide the job scheduling order of
       * pack bitstream multi-threading. This data is not needed if
       * multi-threading is disabled. */
      if (cpi->mt_info.pack_bs_mt_enabled) td->abs_sum_level += level;

      if (allow_update_cdf) {
        if (c == eob - 1) {
          assert(coeff_ctx < 4);
          update_cdf(
              ec_ctx->coeff_base_eob_cdf[txsize_ctx][plane_type][coeff_ctx],
              AOMMIN(level, 3) - 1, 3);
        } else {
          update_cdf(ec_ctx->coeff_base_cdf[txsize_ctx][plane_type][coeff_ctx],
                     AOMMIN(level, 3), 4);
        }
      }
      if (c == eob - 1) {
        assert(coeff_ctx < 4);
#if CONFIG_ENTROPY_STATS
        ++td->counts->coeff_base_eob_multi[cdf_idx][txsize_ctx][plane_type]
                                          [coeff_ctx][AOMMIN(level, 3) - 1];
      } else {
        ++td->counts->coeff_base_multi[cdf_idx][txsize_ctx][plane_type]
                                      [coeff_ctx][AOMMIN(level, 3)];
#endif
      }
      if (level > NUM_BASE_LEVELS) {
        const int base_range = level - 1 - NUM_BASE_LEVELS;
        const int br_ctx = get_br_ctx(levels, pos, bhl, tx_class);
        for (int idx = 0; idx < COEFF_BASE_RANGE; idx += BR_CDF_SIZE - 1) {
          const int k = AOMMIN(base_range - idx, BR_CDF_SIZE - 1);
          if (allow_update_cdf) {
            update_cdf(ec_ctx->coeff_br_cdf[AOMMIN(txsize_ctx, TX_32X32)]
                                           [plane_type][br_ctx],
                       k, BR_CDF_SIZE);
          }
          for (int lps = 0; lps < BR_CDF_SIZE - 1; lps++) {
#if CONFIG_ENTROPY_STATS
            ++td->counts->coeff_lps[AOMMIN(txsize_ctx, TX_32X32)][plane_type]
                                   [lps][br_ctx][lps == k];
#endif  // CONFIG_ENTROPY_STATS
            if (lps == k) break;
          }
#if CONFIG_ENTROPY_STATS
          ++td->counts->coeff_lps_multi[cdf_idx][AOMMIN(txsize_ctx, TX_32X32)]
                                       [plane_type][br_ctx][k];
#endif
          if (k < BR_CDF_SIZE - 1) break;
        }
      }
    }
    // Update the context needed to code the DC sign (if applicable)
    if (tcoeff[0] != 0) {
      const int dc_sign = (tcoeff[0] < 0) ? 1 : 0;
      const int dc_sign_ctx = txb_ctx.dc_sign_ctx;
#if CONFIG_ENTROPY_STATS
      ++td->counts->dc_sign[plane_type][dc_sign_ctx][dc_sign];
#endif  // CONFIG_ENTROPY_STATS
      if (allow_update_cdf)
        update_cdf(ec_ctx->dc_sign_cdf[plane_type][dc_sign_ctx], dc_sign, 2);
      entropy_ctx[block] |= dc_sign_ctx << DC_SIGN_CTX_SHIFT;
    }
  } else {
    tcoeff = qcoeff;
  }
  const uint8_t cul_level =
      av1_get_txb_entropy_context(tcoeff, scan_order, eob);
  av1_set_entropy_contexts(xd, pd, plane, plane_bsize, tx_size, cul_level,
                           blk_col, blk_row);
}